

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

int __thiscall bdHashSet::printHashSet(bdHashSet *this,ostream *out)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60;
  long local_40;
  time_t age;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  local_28;
  iterator it;
  time_t now;
  ostream *out_local;
  bdHashSet *this_local;
  
  it._M_node = (_Base_ptr)time((time_t *)0x0);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&local_28);
  std::operator<<(out,"Hash: ");
  bdStdPrintNodeId(out,&this->mId);
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  local_30 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
             ::begin(&this->mEntries);
  local_28._M_node = local_30;
  while( true ) {
    age = (time_t)std::
                  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
                  ::end(&this->mEntries);
    bVar2 = std::operator!=(&local_28,(_Self *)&age);
    iVar1 = it;
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_28);
    local_40 = (long)iVar1._M_node - (ppVar3->second).mStoreTS;
    poVar4 = std::operator<<(out,"\tK:");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)&local_80,(string *)ppVar3);
    bdStdConvertToPrintable(&local_60,&local_80);
    std::operator<<(poVar4,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    poVar4 = std::operator<<(out," V:");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)&local_d0,(string *)&ppVar3->second);
    bdStdConvertToPrintable(&local_b0,&local_d0);
    std::operator<<(poVar4,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar4 = std::operator<<(out," A:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
    poVar4 = std::operator<<(poVar4," L:");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_28);
    std::ostream::operator<<(poVar4,(ppVar3->second).mLifetime);
    poVar4 = std::operator<<(out," S:");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)&local_110,(string *)&(ppVar3->second).mSecret);
    bdStdConvertToPrintable(&local_f0,&local_110);
    std::operator<<(poVar4,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
    ::operator++(&local_28,0);
  }
  return 1;
}

Assistant:

int	bdHashSet::printHashSet(std::ostream &out) {
	time_t now = time(NULL);
	std::multimap<std::string, bdHashEntry>::iterator it;
	out << "Hash: ";
	bdStdPrintNodeId(out, &mId); // Allowing "Std" as we dont need dht functions everywhere.
	out << std::endl;

	for (it = mEntries.begin(); it != mEntries.end();it++) {
		time_t age = now - it->second.mStoreTS;
		out << "\tK:" << bdStdConvertToPrintable(it->first);
		out << " V:" << bdStdConvertToPrintable(it->second.mValue);
		out << " A:" << age << " L:" << it->second.mLifetime;
		out << " S:" << bdStdConvertToPrintable(it->second.mSecret);
		out << std::endl;
	}
	return 1;
}